

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

void GPU_BlitRectX(GPU_Image *image,GPU_Rect *src_rect,GPU_Target *target,GPU_Rect *dest_rect,
                  float degrees,float pivot_x,float pivot_y,GPU_FlipEnum flip_direction)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  float fVar15;
  float fVar16;
  float scaleX;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined3 uVar6;
  undefined3 uVar7;
  undefined2 uVar8;
  
  if (target == (GPU_Target *)0x0 || image == (GPU_Image *)0x0) {
    return;
  }
  if (src_rect == (GPU_Rect *)0x0) {
    uVar1._0_2_ = image->w;
    uVar1._2_2_ = image->h;
    uVar3 = image->using_virtual_resolution;
    uVar6 = *(undefined3 *)&image->field_0x1d;
    uVar1._4_4_ = CONCAT31(uVar6,uVar3);
    auVar9._8_4_ = 0;
    auVar9._0_8_ = uVar1;
    auVar9._12_2_ = (short)((uint3)uVar6 >> 8);
    auVar11._8_2_ = (short)uVar1._4_4_;
    auVar11._0_8_ = uVar1;
    auVar11._10_4_ = auVar9._10_4_;
    auVar13._6_8_ = 0;
    auVar13._0_6_ = auVar11._8_6_;
    fVar18 = (float)(ushort)(undefined2)uVar1;
    fVar15 = (float)(int)CONCAT82(SUB148(auVar13 << 0x40,6),uVar1._2_2_);
  }
  else {
    fVar18 = src_rect->w;
    fVar15 = src_rect->h;
  }
  if (dest_rect == (GPU_Rect *)0x0) {
    uVar2._0_2_ = target->w;
    uVar2._2_2_ = target->h;
    uVar4 = target->using_virtual_resolution;
    uVar5 = target->field_0x25;
    uVar8 = target->base_w;
    uVar7 = CONCAT21(uVar8,uVar5);
    uVar2._4_4_ = CONCAT31(uVar7,uVar4);
    auVar10._8_4_ = 0;
    auVar10._0_8_ = uVar2;
    auVar10._12_2_ = uVar8;
    auVar12._8_2_ = (short)uVar2._4_4_;
    auVar12._0_8_ = uVar2;
    auVar12._10_4_ = auVar10._10_4_;
    auVar14._6_8_ = 0;
    auVar14._0_6_ = auVar12._8_6_;
    fVar17 = (float)(ushort)(undefined2)uVar2;
    fVar19 = (float)(int)CONCAT82(SUB148(auVar14 << 0x40,6),uVar2._2_2_);
    fVar16 = 0.0;
    fVar20 = 0.0;
  }
  else {
    fVar16 = dest_rect->x;
    fVar20 = dest_rect->y;
    fVar17 = dest_rect->w;
    fVar19 = dest_rect->h;
  }
  scaleX = fVar17 / fVar18;
  if ((flip_direction & 1) != 0) {
    scaleX = -scaleX;
    fVar16 = fVar16 + fVar17;
    pivot_x = fVar18 - pivot_x;
  }
  fVar18 = fVar19 / fVar15;
  if ((flip_direction & 2) != 0) {
    fVar18 = -fVar18;
    fVar20 = fVar20 + fVar19;
    pivot_y = fVar15 - pivot_y;
  }
  GPU_BlitTransformX(image,src_rect,target,pivot_x * scaleX + fVar16,pivot_y * fVar18 + fVar20,
                     pivot_x,pivot_y,degrees,scaleX,fVar18);
  return;
}

Assistant:

void GPU_BlitRectX(GPU_Image* image, GPU_Rect* src_rect, GPU_Target* target, GPU_Rect* dest_rect, float degrees, float pivot_x, float pivot_y, GPU_FlipEnum flip_direction)
{
    float w, h;
    float dx, dy;
    float dw, dh;
    float scale_x, scale_y;
    
    if(image == NULL || target == NULL)
        return;
    
    if(src_rect == NULL)
    {
        w = image->w;
        h = image->h;
    }
    else
    {
        w = src_rect->w;
        h = src_rect->h;
    }
    
    if(dest_rect == NULL)
    {
        dx = 0.0f;
        dy = 0.0f;
        dw = target->w;
        dh = target->h;
    }
    else
    {
        dx = dest_rect->x;
        dy = dest_rect->y;
        dw = dest_rect->w;
        dh = dest_rect->h;
    }
    
    scale_x = dw / w;
    scale_y = dh / h;
    
    if(flip_direction & GPU_FLIP_HORIZONTAL)
    {
        scale_x = -scale_x;
        dx += dw;
        pivot_x = w - pivot_x;
    }
    if(flip_direction & GPU_FLIP_VERTICAL)
    {
        scale_y = -scale_y;
        dy += dh;
        pivot_y = h - pivot_y;
    }
    
    GPU_BlitTransformX(image, src_rect, target, dx + pivot_x * scale_x, dy + pivot_y * scale_y, pivot_x, pivot_y, degrees, scale_x, scale_y);
}